

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

float __thiscall Assimp::XGLImporter::ReadFloat(XGLImporter *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Assimp *pAVar3;
  ulong uVar4;
  Assimp *this_00;
  float t;
  float local_c;
  
  bVar1 = SkipToText(this);
  if (bVar1) {
    iVar2 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    this_00 = (Assimp *)CONCAT44(extraout_var,iVar2);
    while( true ) {
      uVar4 = (ulong)(byte)*this_00;
      if (0x20 < uVar4) break;
      if ((0x100000200U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar4 & 0x3f) & 1) != 0) goto LAB_005e50a1;
        break;
      }
      this_00 = this_00 + 1;
    }
    pAVar3 = (Assimp *)
             fast_atoreal_move<float>(this_00,(char *)&local_c,(float *)0x1,(bool)*this_00);
    if (this_00 != pAVar3) {
      return local_c;
    }
  }
LAB_005e50a1:
  LogFunctions<Assimp::XGLImporter>::LogError((char *)0x5e50a6);
  return 0.0;
}

Assistant:

float XGLImporter::ReadFloat()
{
    if(!SkipToText()) {
        LogError("unexpected EOF reading float element contents");
        return 0.f;
    }
    const char* s = m_reader->getNodeData(), *se;

    if(!SkipSpaces(&s)) {
        LogError("unexpected EOL, failed to parse float");
        return 0.f;
    }

    float t;
    se = fast_atoreal_move(s,t);

    if (se == s) {
        LogError("failed to read float text");
        return 0.f;
    }

    return t;
}